

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstrList * bsplits(const_bstring str,const_bstring splitStr)

{
  int iVar1;
  uchar *puVar2;
  const_bstring local_30;
  genBstrList g;
  const_bstring splitStr_local;
  const_bstring str_local;
  
  if ((((str == (const_bstring)0x0) || (str->slen < 0)) || (str->data == (uchar *)0x0)) ||
     (((splitStr == (const_bstring)0x0 || (splitStr->slen < 0)) || (splitStr->data == (uchar *)0x0))
     )) {
    str_local = (const_bstring)0x0;
  }
  else {
    g.bl = (bstrList *)splitStr;
    g.b = (bstring)malloc(0x10);
    if (g.b == (bstring)0x0) {
      str_local = (const_bstring)0x0;
    }
    else {
      (g.b)->slen = 4;
      puVar2 = (uchar *)malloc((long)(g.b)->slen << 3);
      (g.b)->data = puVar2;
      if ((g.b)->data == (uchar *)0x0) {
        free(g.b);
        str_local = (const_bstring)0x0;
      }
      else {
        (g.b)->mlen = 0;
        local_30 = str;
        iVar1 = bsplitscb(str,(const_bstring)g.bl,0,bscb,&local_30);
        if (iVar1 < 0) {
          bstrListDestroy((bstrList *)g.b);
          str_local = (const_bstring)0x0;
        }
        else {
          str_local = g.b;
        }
      }
    }
  }
  return (bstrList *)str_local;
}

Assistant:

struct bstrList * bsplits (const_bstring str, const_bstring splitStr) {
struct genBstrList g;

	if (     str == NULL ||      str->slen < 0 ||      str->data == NULL ||
	    splitStr == NULL || splitStr->slen < 0 || splitStr->data == NULL)
		return NULL;

	g.bl = (struct bstrList *) bstr__alloc (sizeof (struct bstrList));
	if (g.bl == NULL) return NULL;
	g.bl->mlen = 4;
	g.bl->entry = (bstring *) bstr__alloc (g.bl->mlen * sizeof (bstring));
	if (NULL == g.bl->entry) {
		bstr__free (g.bl);
		return NULL;
	}
	g.b = (bstring) str;
	g.bl->qty = 0;

	if (bsplitscb (str, splitStr, 0, bscb, &g) < 0) {
		bstrListDestroy (g.bl);
		return NULL;
	}
	return g.bl;
}